

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_load(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  long *plVar5;
  TValue *io2;
  TValue *io1;
  TValue *gt;
  LClosure *f;
  undefined1 local_58 [4];
  int status;
  ZIO z;
  char *mode_local;
  char *chunkname_local;
  void *data_local;
  lua_Reader reader_local;
  lua_State *L_local;
  
  mode_local = chunkname;
  if (chunkname == (char *)0x0) {
    mode_local = "?";
  }
  z.L = (lua_State *)mode;
  luaZ_init(L,(ZIO *)local_58,reader,data);
  iVar4 = luaD_protectedparser(L,(ZIO *)local_58,mode_local,(char *)z.L);
  if ((iVar4 == 0) && (lVar1 = *(long *)((L->top).offset + -0x10), *(char *)(lVar1 + 10) != '\0')) {
    lVar2 = *(long *)((L->l_G->l_registry).value_.f + 0x10);
    plVar5 = (long *)(lVar2 + 0x10);
    plVar3 = *(long **)(*(long *)(lVar1 + 0x20) + 0x10);
    *plVar3 = *plVar5;
    *(undefined1 *)(plVar3 + 1) = *(undefined1 *)(lVar2 + 0x18);
    if (((*(byte *)(lVar2 + 0x18) & 0x40) != 0) &&
       (((*(byte *)(*(long *)(lVar1 + 0x20) + 9) & 0x20) != 0 &&
        ((*(byte *)(*plVar5 + 9) & 0x18) != 0)))) {
      luaC_barrier_(L,*(GCObject **)(lVar1 + 0x20),(GCObject *)*plVar5);
    }
  }
  return iVar4;
}

Assistant:

LUA_API int lua_load (lua_State *L, lua_Reader reader, void *data,
                      const char *chunkname, const char *mode) {
  ZIO z;
  int status;
  lua_lock(L);
  if (!chunkname) chunkname = "?";
  luaZ_init(L, &z, reader, data);
  status = luaD_protectedparser(L, &z, chunkname, mode);
  if (status == LUA_OK) {  /* no errors? */
    LClosure *f = clLvalue(s2v(L->top.p - 1));  /* get new function */
    if (f->nupvalues >= 1) {  /* does it have an upvalue? */
      /* get global table from registry */
      const TValue *gt = getGtable(L);
      /* set global table as 1st upvalue of 'f' (may be LUA_ENV) */
      setobj(L, f->upvals[0]->v.p, gt);
      luaC_barrier(L, f->upvals[0], gt);
    }
  }
  lua_unlock(L);
  return status;
}